

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O3

ElemMat * __thiscall lf::assemble::test::MVMultAssembler::Eval(MVMultAssembler *this,Entity *cell)

{
  non_const_type pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  double dVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  stringstream ss;
  string local_210;
  undefined1 local_1f0 [32];
  string local_1d0;
  undefined1 local_1b0 [16];
  scalar_constant_op<double> local_1a0;
  scalar_constant_op<double> local_190;
  
  uVar6 = (*this->mesh_->_vptr_Mesh[5])();
  uVar7 = (*cell->_vptr_Entity[4])(cell);
  if ((char)uVar7 == '\x04') {
    if (((this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.
         m_rows != 4) ||
       ((this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_cols
        != 4)) {
      (this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_rows =
           4;
      (this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_cols =
           4;
    }
    lVar8 = 0;
    do {
      puVar3 = (undefined8 *)
               ((long)(this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.
                      m_storage.m_data.array + lVar8);
      *puVar3 = 0xbff0000000000000;
      puVar3[1] = 0xbff0000000000000;
      puVar3 = (undefined8 *)
               ((long)(this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.
                      m_storage.m_data.array + lVar8 + 0x10);
      *puVar3 = 0xbff0000000000000;
      puVar3[1] = 0xbff0000000000000;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    dVar11 = (double)uVar6;
    local_1a0.m_other = 1.0;
    local_190.m_other = dVar11;
    Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>,_0>::Diagonal
              ((Diagonal<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_0> *)local_1f0,&this->mat_,0);
    Eigen::internal::
    resize_if_allowed<Eigen::Diagonal<Eigen::Matrix<double,_1,_1,1,4,4>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const>,double,double>
              ((Diagonal<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_0> *)local_1f0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                *)local_1b0,(assign_op<double,_double> *)&local_210);
    auVar5 = _DAT_00240020;
    dVar4 = *(double *)(local_1f0._0_8_ + 0x88);
    dVar9 = *(double *)(local_1f0._0_8_ + 0x80);
    if ((long)dVar4 < (long)*(double *)(local_1f0._0_8_ + 0x80)) {
      dVar9 = dVar4;
    }
    if (0 < (long)dVar9) {
      lVar8 = (long)dVar9 + -1;
      auVar13._8_4_ = (int)lVar8;
      auVar13._0_8_ = lVar8;
      auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar10 = 0;
      auVar13 = auVar13 ^ _DAT_00240020;
      auVar14 = _DAT_00240010;
      do {
        auVar15 = auVar14 ^ auVar5;
        if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                    auVar13._4_4_ < auVar15._4_4_) & 1)) {
          *(double *)
           &((non_const_type)local_1f0._0_8_)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> = dVar11;
        }
        if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
            auVar15._12_4_ <= auVar13._12_4_) {
          (((non_const_type)local_1f0._0_8_)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>).m_storage.m_data.array
          [(long)dVar4 + 1] = dVar11;
        }
        uVar10 = uVar10 + 2;
        lVar8 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar8 + 2;
        local_1f0._0_8_ =
             (((non_const_type)local_1f0._0_8_)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>).m_storage.m_data.array
             + (long)dVar4 * 2U + 2;
      } while (((long)dVar9 + 1U & 0xfffffffffffffffe) != uVar10);
    }
  }
  else {
    if ((uVar7 & 0xff) != 3) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Illegal cell type",0x11);
      pMVar1 = (non_const_type)(local_1f0 + 0x10);
      local_1f0._0_8_ = pMVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"false","");
      paVar2 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_1f0,&local_210,0x29b,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((non_const_type)local_1f0._0_8_ != pMVar1) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      local_1f0._0_8_ = pMVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"false","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                 ,"");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
      base::AssertionFailed((string *)local_1f0,&local_210,0x29b,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)local_1f0);
      abort();
    }
    if (((this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.
         m_rows != 3) ||
       ((this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_cols
        != 3)) {
      (this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_rows =
           3;
      (this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_cols =
           3;
    }
    lVar8 = 0x20;
    do {
      *(undefined8 *)
       ((long)(this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.
              m_data.array + lVar8 + -0x20) = 0xbff0000000000000;
      *(undefined8 *)
       ((long)(this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.
              m_data.array + lVar8 + -0x18) = 0xbff0000000000000;
      *(undefined8 *)
       ((long)(this->mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.
              m_data.array + lVar8 + -0x10) = 0xbff0000000000000;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x68);
    dVar11 = (double)uVar6;
    local_1a0.m_other = 1.0;
    local_190.m_other = dVar11;
    Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>,_0>::Diagonal
              ((Diagonal<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_0> *)local_1f0,&this->mat_,0);
    Eigen::internal::
    resize_if_allowed<Eigen::Diagonal<Eigen::Matrix<double,_1,_1,1,4,4>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>,double,double>
              ((Diagonal<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_0> *)local_1f0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_1b0,(assign_op<double,_double> *)&local_210);
    auVar5 = _DAT_00240020;
    dVar4 = *(double *)(local_1f0._0_8_ + 0x88);
    dVar9 = *(double *)(local_1f0._0_8_ + 0x80);
    if ((long)dVar4 < (long)*(double *)(local_1f0._0_8_ + 0x80)) {
      dVar9 = dVar4;
    }
    if (0 < (long)dVar9) {
      lVar8 = (long)dVar9 + -1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_00240020;
      auVar15 = _DAT_00240010;
      do {
        auVar14 = auVar15 ^ auVar5;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *(double *)
           &((non_const_type)local_1f0._0_8_)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> = dVar11;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          (((non_const_type)local_1f0._0_8_)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>).m_storage.m_data.array
          [(long)dVar4 + 1] = dVar11;
        }
        uVar10 = uVar10 + 2;
        lVar8 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar8 + 2;
        local_1f0._0_8_ =
             (((non_const_type)local_1f0._0_8_)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>).m_storage.m_data.array
             + (long)dVar4 * 2U + 2;
      } while (((long)dVar9 + 1U & 0xfffffffffffffffe) != uVar10);
    }
  }
  return &this->mat_;
}

Assistant:

MVMultAssembler::ElemMat &MVMultAssembler::Eval(const lf::mesh::Entity &cell) {
  const lf::base::glb_idx_t cell_idx = mesh_.Index(cell);
  const lf::base::RefEl ref_el = cell.RefEl();
  switch (ref_el) {
    case lf::base::RefEl::kTria(): {
      mat_ = Eigen::Matrix3d::Constant(3, 3, -1.0);
      mat_.diagonal() = (Eigen::Vector3d::Constant(3, 1.0) * (double)cell_idx);
      break;
    }
    case lf::base::RefEl::kQuad(): {
      mat_ = Eigen::Matrix4d::Constant(4, 4, -1.0);
      mat_.diagonal() = (Eigen::Vector4d::Constant(4, 1.0) * (double)cell_idx);
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal cell type");
      break;
    }
  }  // end switch
  return mat_;
}